

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t archive_read_format_zip_seekable_read_header(archive_read *a,archive_entry *entry)

{
  zip *zip_00;
  wchar_t wVar1;
  zip_entry *pzVar2;
  int64_t iVar3;
  wchar_t local_40;
  wchar_t ret2;
  wchar_t ret;
  wchar_t r;
  int64_t offset;
  zip_entry *rsrc;
  zip *zip;
  archive_entry *entry_local;
  archive_read *a_local;
  
  zip_00 = (zip *)a->format->data;
  local_40 = L'\0';
  if (zip_00->has_encrypted_entries == -1) {
    zip_00->has_encrypted_entries = 0;
  }
  (a->archive).archive_format = 0x50000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "ZIP";
  }
  if (zip_00->zip_entries == (zip_entry *)0x0) {
    wVar1 = slurp_central_directory(a,zip_00);
    if (wVar1 != L'\0') {
      return wVar1;
    }
    pzVar2 = (zip_entry *)__archive_rb_tree_iterate(&zip_00->tree,(archive_rb_node *)0x0,0);
    zip_00->entry = pzVar2;
  }
  else if (zip_00->entry != (zip_entry *)0x0) {
    pzVar2 = (zip_entry *)__archive_rb_tree_iterate(&zip_00->tree,&zip_00->entry->node,1);
    zip_00->entry = pzVar2;
  }
  if (zip_00->entry == (zip_entry *)0x0) {
    a_local._4_4_ = L'\x01';
  }
  else {
    if ((zip_00->entry->rsrcname).s == (char *)0x0) {
      offset = 0;
    }
    else {
      offset = (int64_t)__archive_rb_tree_find_node(&zip_00->tree_rsrc,(zip_00->entry->rsrcname).s);
    }
    iVar3 = archive_filter_bytes(&a->archive,0);
    if (iVar3 < zip_00->entry->local_header_offset) {
      __archive_read_consume(a,zip_00->entry->local_header_offset - iVar3);
    }
    else if (iVar3 != zip_00->entry->local_header_offset) {
      __archive_read_seek(a,zip_00->entry->local_header_offset,0);
    }
    zip_00->unconsumed = 0;
    a_local._4_4_ = zip_read_local_file_header(a,entry,zip_00);
    if (a_local._4_4_ == L'\0') {
      if ((offset != 0) &&
         (wVar1 = zip_read_mac_metadata(a,entry,(zip_entry *)offset), wVar1 < L'\0')) {
        local_40 = wVar1;
      }
      a_local._4_4_ = local_40;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_zip_seekable_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct zip *zip = (struct zip *)a->format->data;
	struct zip_entry *rsrc;
	int64_t offset;
	int r, ret = ARCHIVE_OK;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "ZIP";

	if (zip->zip_entries == NULL) {
		r = slurp_central_directory(a, zip);
		if (r != ARCHIVE_OK)
			return r;
		/* Get first entry whose local header offset is lower than
		 * other entries in the archive file. */
		zip->entry =
		    (struct zip_entry *)ARCHIVE_RB_TREE_MIN(&zip->tree);
	} else if (zip->entry != NULL) {
		/* Get next entry in local header offset order. */
		zip->entry = (struct zip_entry *)__archive_rb_tree_iterate(
		    &zip->tree, &zip->entry->node, ARCHIVE_RB_DIR_RIGHT);
	}

	if (zip->entry == NULL)
		return ARCHIVE_EOF;

	if (zip->entry->rsrcname.s)
		rsrc = (struct zip_entry *)__archive_rb_tree_find_node(
		    &zip->tree_rsrc, zip->entry->rsrcname.s);
	else
		rsrc = NULL;

	/* File entries are sorted by the header offset, we should mostly
	 * use __archive_read_consume to advance a read point to avoid redundant
	 * data reading.  */
	offset = archive_filter_bytes(&a->archive, 0);
	if (offset < zip->entry->local_header_offset)
		__archive_read_consume(a,
		    zip->entry->local_header_offset - offset);
	else if (offset != zip->entry->local_header_offset) {
		__archive_read_seek(a, zip->entry->local_header_offset, SEEK_SET);
	}
	zip->unconsumed = 0;
	r = zip_read_local_file_header(a, entry, zip);
	if (r != ARCHIVE_OK)
		return r;
	if (rsrc) {
		int ret2 = zip_read_mac_metadata(a, entry, rsrc);
		if (ret2 < ret)
			ret = ret2;
	}
	return (ret);
}